

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O2

int32_t internal_exr_compute_chunk_offset_size(_internal_exr_part *curpart)

{
  int iVar1;
  int iVar2;
  exr_attr_chlist_t *peVar3;
  exr_attr_tiledesc_t *peVar4;
  exr_attr_chlist_entry_t *peVar5;
  bool bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint64_t uVar13;
  int16_t iVar14;
  
  peVar3 = (curpart->channels->field_6).chlist;
  if (curpart->tiles != (exr_attribute_t *)0x0) {
    peVar4 = (curpart->tiles->field_6).tiledesc;
    bVar7 = peVar4->level_and_round & 0xf;
    if (bVar7 < 2) {
      uVar8 = 0;
      uVar10 = (ulong)(uint)curpart->num_tile_levels_x;
      if (curpart->num_tile_levels_x < 1) {
        uVar10 = uVar8;
      }
      lVar11 = 0;
      for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        lVar11 = lVar11 + (long)curpart->tile_level_tile_count_y[uVar8] *
                          (long)curpart->tile_level_tile_count_x[uVar8];
      }
      if (0x7fffffff < lVar11) {
        return -1;
      }
    }
    else {
      if (bVar7 != 2) {
        return -1;
      }
      uVar10 = (ulong)(uint)curpart->num_tile_levels_x;
      if (curpart->num_tile_levels_x < 1) {
        uVar10 = 0;
      }
      lVar11 = 0;
      for (uVar8 = 0; uVar8 != uVar10; uVar8 = uVar8 + 1) {
        uVar12 = (ulong)(uint)curpart->num_tile_levels_y;
        if (curpart->num_tile_levels_y < 1) {
          uVar12 = 0;
        }
        uVar9 = 0;
        while (uVar12 != uVar9) {
          lVar11 = lVar11 + (long)curpart->tile_level_tile_count_y[uVar9] *
                            (long)curpart->tile_level_tile_count_x[uVar8];
          uVar9 = uVar9 + 1;
          if (0x7fffffff < lVar11) {
            return -1;
          }
        }
      }
    }
    uVar8 = 0;
    uVar10 = (ulong)(uint)peVar3->num_channels;
    if (peVar3->num_channels < 1) {
      uVar10 = uVar8;
    }
    iVar14 = 0;
    uVar13 = 0;
    for (; uVar10 * 0x20 != uVar8; uVar8 = uVar8 + 0x20) {
      peVar5 = peVar3->entries;
      uVar12 = (ulong)*(int *)(peVar5->reserved + uVar8 + 7);
      if (uVar12 < 2) {
        uVar12 = (ulong)peVar4->y_size;
      }
      else {
        uVar12 = ((peVar4->y_size + uVar12) - 1) / uVar12;
        iVar14 = 1;
      }
      uVar13 = uVar13 + uVar12 * ((((ulong)peVar4->x_size +
                                   (long)*(int *)(peVar5->reserved + uVar8 + 3)) - 1) /
                                  (ulong)(long)*(int *)(peVar5->reserved + uVar8 + 3) <<
                                 (2U - (*(int *)(peVar5->reserved + (uVar8 - 5)) == 1) & 0x3f));
    }
    curpart->unpacked_size_per_chunk = uVar13;
    curpart->chan_has_line_sampling = iVar14;
    return (int32_t)lVar11;
  }
  if (EXR_COMPRESSION_DWAB < curpart->comp_type) {
    return -1;
  }
  switch(curpart->comp_type) {
  case EXR_COMPRESSION_NONE:
  case EXR_COMPRESSION_RLE:
  case EXR_COMPRESSION_ZIPS:
    uVar10 = 1;
    bVar6 = true;
    goto LAB_00118982;
  case EXR_COMPRESSION_ZIP:
  case EXR_COMPRESSION_PXR24:
    uVar10 = 0x10;
    break;
  default:
    uVar10 = 0x20;
    break;
  case EXR_COMPRESSION_DWAB:
    uVar10 = 0x100;
  }
  bVar6 = false;
LAB_00118982:
  iVar1 = (curpart->data_window).min.field_0.field_0.y;
  iVar2 = (curpart->data_window).max.field_0.field_0.y;
  uVar12 = 0;
  uVar8 = (ulong)(uint)peVar3->num_channels;
  if (peVar3->num_channels < 1) {
    uVar8 = uVar12;
  }
  iVar14 = 0;
  uVar13 = 0;
  for (; uVar8 * 0x20 != uVar12; uVar12 = uVar12 + 0x20) {
    peVar5 = peVar3->entries;
    uVar9 = (ulong)*(int *)(peVar5->reserved + uVar12 + 7);
    lVar11 = ((((long)(curpart->data_window).max.field_0.field_0.x -
               (long)(curpart->data_window).min.field_0.field_0.x) + 1U) /
              (ulong)(long)*(int *)(peVar5->reserved + uVar12 + 3) <<
             (2U - (*(int *)(peVar5->reserved + (uVar12 - 5)) == 1) & 0x3f)) * uVar10;
    if (1 < uVar9) {
      iVar14 = 1;
    }
    if (1 < uVar9 && !bVar6) {
      lVar11 = lVar11 * (uVar10 / uVar9);
      iVar14 = 1;
    }
    uVar13 = uVar13 + lVar11;
  }
  curpart->unpacked_size_per_chunk = uVar13;
  curpart->lines_per_chunk = (int16_t)uVar10;
  curpart->chan_has_line_sampling = iVar14;
  return (int32_t)((((long)iVar2 - (long)iVar1) + uVar10) / uVar10);
}

Assistant:

int32_t
internal_exr_compute_chunk_offset_size (struct _internal_exr_part* curpart)
{
    int32_t                  retval       = 0;
    const exr_attr_box2i_t   dw           = curpart->data_window;
    const exr_attr_chlist_t* channels     = curpart->channels->chlist;
    uint64_t                 unpackedsize = 0;
    uint64_t                 w;
    int                      hasLineSample = 0;

    w = (uint64_t) (((int64_t) dw.max.x) - ((int64_t) dw.min.x) + 1);

    if (curpart->tiles)
    {
        const exr_attr_tiledesc_t* tiledesc  = curpart->tiles->tiledesc;
        int64_t                    tilecount = 0;

        switch (EXR_GET_TILE_LEVEL_MODE ((*tiledesc)))
        {
            case EXR_TILE_ONE_LEVEL:
            case EXR_TILE_MIPMAP_LEVELS:
                for (int32_t l = 0; l < curpart->num_tile_levels_x; ++l)
                    tilecount +=
                        ((int64_t) curpart->tile_level_tile_count_x[l] *
                         (int64_t) curpart->tile_level_tile_count_y[l]);
                if (tilecount > (int64_t) INT_MAX) return -1;
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_RIPMAP_LEVELS:
                for (int32_t lx = 0; lx < curpart->num_tile_levels_x; ++lx)
                {
                    for (int32_t ly = 0; ly < curpart->num_tile_levels_y; ++ly)
                    {
                        tilecount +=
                            ((int64_t) curpart->tile_level_tile_count_x[lx] *
                             (int64_t) curpart->tile_level_tile_count_y[ly]);

                        if (tilecount > (int64_t) INT_MAX) return -1;
                    }
                }
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_LAST_TYPE:
            default: return -1;
        }

        for (int c = 0; c < channels->num_channels; ++c)
        {
            uint64_t xsamp  = (uint64_t) channels->entries[c].x_sampling;
            uint64_t ysamp  = (uint64_t) channels->entries[c].y_sampling;
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= (((uint64_t) tiledesc->x_size + xsamp - 1) / xsamp);
            if (ysamp > 1)
            {
                hasLineSample = 1;
                cunpsz *= (((uint64_t) tiledesc->y_size + ysamp - 1) / ysamp);
            }
            else
                cunpsz *= (uint64_t) tiledesc->y_size;
            unpackedsize += cunpsz;
        }
        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);
    }
    else
    {
        uint64_t linePerChunk, h;
        switch (curpart->comp_type)
        {
            case EXR_COMPRESSION_NONE:
            case EXR_COMPRESSION_RLE:
            case EXR_COMPRESSION_ZIPS: linePerChunk = 1; break;
            case EXR_COMPRESSION_ZIP:
            case EXR_COMPRESSION_PXR24: linePerChunk = 16; break;
            case EXR_COMPRESSION_PIZ:
            case EXR_COMPRESSION_B44:
            case EXR_COMPRESSION_B44A:
            case EXR_COMPRESSION_DWAA: linePerChunk = 32; break;
            case EXR_COMPRESSION_DWAB: linePerChunk = 256; break;
            case EXR_COMPRESSION_LAST_TYPE:
            default:
                /* ERROR CONDITION */
                return -1;
        }

        for (int c = 0; c < channels->num_channels; ++c)
        {
            uint64_t xsamp  = (uint64_t) channels->entries[c].x_sampling;
            uint64_t ysamp  = (uint64_t) channels->entries[c].y_sampling;
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= w / xsamp;
            cunpsz *= linePerChunk;
            if (ysamp > 1)
            {
                hasLineSample = 1;
                if (linePerChunk > 1) cunpsz *= linePerChunk / ysamp;
            }
            unpackedsize += cunpsz;
        }

        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->lines_per_chunk         = ((int16_t) linePerChunk);
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);

        h      = (uint64_t) ((int64_t) dw.max.y - (int64_t) dw.min.y + 1);
        retval = (int32_t) ((h + linePerChunk - 1) / linePerChunk);
    }
    return retval;
}